

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::one_thread::impl::disp_binder_t::unbind_agent
          (disp_binder_t *this,environment_t *env,agent_ref_t *agent_ref)

{
  atomic_refcounted_t *paVar1;
  agent_ref_t local_30;
  environment_t local_28;
  
  environment_t::query_named_dispatcher(&local_28,(string *)env);
  local_30 = (agent_ref_t)agent_ref->m_obj;
  agent_ref->m_obj = (agent_t *)0x0;
  unbind_agent_from_disp(this,(dispatcher_t *)local_28._vptr_environment_t,&local_30);
  if (local_30.m_obj != (agent_t *)0x0) {
    LOCK();
    paVar1 = &(local_30.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_30.m_obj != (agent_t *)0x0)) {
      (*(local_30.m_obj)->_vptr_agent_t[1])();
    }
    local_30.m_obj = (agent_t *)0x0;
  }
  if ((_Head_base<0UL,_so_5::environment_t::internals_t_*,_false>)
      local_28.m_impl._M_t.
      super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
      .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl !=
      (_Head_base<0UL,_so_5::environment_t::internals_t_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_28.m_impl._M_t.
               super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
               .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

virtual void
		unbind_agent(
			environment_t & env,
			agent_ref_t agent_ref ) override
		{
			return unbind_agent_from_disp( 
				env.query_named_dispatcher( m_disp_name ).get(),
				std::move( agent_ref ) );
		}